

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PInt::PInt(PInt *this,uint size,bool unsign)

{
  PSymbolConstNumeric *pPVar1;
  undefined7 in_register_00000011;
  uint val;
  FName local_38;
  FName local_34;
  FName local_30;
  FName local_2c;
  
  PBasicType::PBasicType((PBasicType *)this,size,size);
  *(undefined ***)this = &PTR_StaticType_007c77c0;
  this->Unsigned = unsign;
  if ((int)CONCAT71(in_register_00000011,unsign) == 0) {
    val = -1 << ((char)(size << 3) - 1U & 0x1f);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_2c.Index = 0x23a;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_2c,(PType *)this,val);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_30.Index = 0x23b;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_30,(PType *)this,~val);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  else {
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_34.Index = 0x23a;
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar1,&local_34,(PType *)this,0);
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
    pPVar1 = (PSymbolConstNumeric *)DObject::operator_new(0x38);
    local_38.Index = 0x23b;
    PSymbolConstNumeric::PSymbolConstNumeric
              (pPVar1,&local_38,(PType *)this,~(-1 << ((byte)(size << 3) & 0x1f)));
    PSymbolTable::AddSymbol((PSymbolTable *)&this->field_0x38,(PSymbol *)pPVar1);
  }
  return;
}

Assistant:

PInt::PInt(unsigned int size, bool unsign)
: PBasicType(size, size), Unsigned(unsign)
{
	if (!unsign)
	{
		int maxval = (1 << ((8 * size) - 1)) - 1;
		int minval = -maxval - 1;
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, minval));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, maxval));
	}
	else
	{
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Min, this, 0u));
		Symbols.AddSymbol(new PSymbolConstNumeric(NAME_Max, this, (1u << (8 * size)) - 1));
	}
}